

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imKStoUCS.c
# Opt level: O0

uint KeySymToUcs4(KeySym keysym)

{
  KeySym keysym_local;
  
  keysym_local._4_4_ = (uint)keysym;
  if ((keysym & 0xff000000) == 0x1000000) {
    keysym_local._4_4_ = keysym_local._4_4_ & 0xffffff;
  }
  else if ((keysym == 0) || (0xff < keysym)) {
    if ((keysym < 0x1a1) || (0x1ff < keysym)) {
      if ((keysym < 0x2a1) || (0x2fe < keysym)) {
        if ((keysym < 0x3a2) || (0x3fe < keysym)) {
          if ((keysym < 0x4a1) || (0x4df < keysym)) {
            if ((keysym < 0x58a) || (0x5fe < keysym)) {
              if ((keysym < 0x680) || (0x6ff < keysym)) {
                if ((keysym < 0x7a1) || (0x7f9 < keysym)) {
                  if ((keysym < 0x8a4) || (0x8fe < keysym)) {
                    if ((keysym < 0x9df) || (0x9f8 < keysym)) {
                      if ((keysym < 0xaa1) || (0xafe < keysym)) {
                        if ((keysym < 0xcdf) || (0xcfa < keysym)) {
                          if ((keysym < 0xda1) || (0xdf9 < keysym)) {
                            if ((keysym < 0xea0) || (0xeff < keysym)) {
                              if ((keysym < 0x12a1) || (0x12fe < keysym)) {
                                if ((keysym < 0x13bc) || (0x13be < keysym)) {
                                  if ((keysym < 0x14a1) || (0x14ff < keysym)) {
                                    if ((keysym < 0x15d0) || (0x15f6 < keysym)) {
                                      if ((keysym < 0x16a0) || (0x16f6 < keysym)) {
                                        if ((keysym < 0x1e9f) || (0x1eff < keysym)) {
                                          if ((keysym < 0x20a0) || (0x20ac < keysym)) {
                                            keysym_local._4_4_ = 0;
                                          }
                                          else {
                                            keysym_local._4_4_ =
                                                 (uint)keysym_to_unicode_20a0_20ac[keysym - 0x20a0];
                                          }
                                        }
                                        else {
                                          keysym_local._4_4_ =
                                               (uint)keysym_to_unicode_1e9f_1eff[keysym - 0x1e9f];
                                        }
                                      }
                                      else {
                                        keysym_local._4_4_ =
                                             (uint)keysym_to_unicode_16a0_16f6[keysym - 0x16a0];
                                      }
                                    }
                                    else {
                                      keysym_local._4_4_ =
                                           (uint)keysym_to_unicode_15d0_15f6[keysym - 0x15d0];
                                    }
                                  }
                                  else {
                                    keysym_local._4_4_ =
                                         (uint)keysym_to_unicode_14a1_14ff[keysym - 0x14a1];
                                  }
                                }
                                else {
                                  keysym_local._4_4_ =
                                       (uint)keysym_to_unicode_13bc_13be[keysym - 0x13bc];
                                }
                              }
                              else {
                                keysym_local._4_4_ =
                                     (uint)keysym_to_unicode_12a1_12fe[keysym - 0x12a1];
                              }
                            }
                            else {
                              keysym_local._4_4_ = (uint)keysym_to_unicode_ea0_eff[keysym - 0xea0];
                            }
                          }
                          else {
                            keysym_local._4_4_ = (uint)keysym_to_unicode_da1_df9[keysym - 0xda1];
                          }
                        }
                        else {
                          keysym_local._4_4_ = (uint)keysym_to_unicode_cdf_cfa[keysym - 0xcdf];
                        }
                      }
                      else {
                        keysym_local._4_4_ = (uint)keysym_to_unicode_aa1_afe[keysym - 0xaa1];
                      }
                    }
                    else {
                      keysym_local._4_4_ = (uint)keysym_to_unicode_9df_9f8[keysym - 0x9df];
                    }
                  }
                  else {
                    keysym_local._4_4_ = (uint)keysym_to_unicode_8a4_8fe[keysym - 0x8a4];
                  }
                }
                else {
                  keysym_local._4_4_ = (uint)keysym_to_unicode_7a1_7f9[keysym - 0x7a1];
                }
              }
              else {
                keysym_local._4_4_ = (uint)keysym_to_unicode_680_6ff[keysym - 0x680];
              }
            }
            else {
              keysym_local._4_4_ = (uint)keysym_to_unicode_590_5fe[keysym - 0x590];
            }
          }
          else {
            keysym_local._4_4_ = (uint)keysym_to_unicode_4a1_4df[keysym - 0x4a1];
          }
        }
        else {
          keysym_local._4_4_ = (uint)keysym_to_unicode_3a2_3fe[keysym - 0x3a2];
        }
      }
      else {
        keysym_local._4_4_ = (uint)keysym_to_unicode_2a1_2fe[keysym - 0x2a1];
      }
    }
    else {
      keysym_local._4_4_ = (uint)keysym_to_unicode_1a1_1ff[keysym - 0x1a1];
    }
  }
  return keysym_local._4_4_;
}

Assistant:

static unsigned int
KeySymToUcs4(KeySym keysym)
{
    /* 'Unicode keysym' */
    if ((keysym & 0xff000000) == 0x01000000)
        return (keysym & 0x00ffffff);

    if (keysym > 0 && keysym < 0x100)
	return keysym;
    else if (keysym > 0x1a0 && keysym < 0x200)
	return keysym_to_unicode_1a1_1ff[keysym - 0x1a1];
    else if (keysym > 0x2a0 && keysym < 0x2ff)
	return keysym_to_unicode_2a1_2fe[keysym - 0x2a1];
    else if (keysym > 0x3a1 && keysym < 0x3ff)
	return keysym_to_unicode_3a2_3fe[keysym - 0x3a2];
    else if (keysym > 0x4a0 && keysym < 0x4e0)
	return keysym_to_unicode_4a1_4df[keysym - 0x4a1];
    else if (keysym > 0x589 && keysym < 0x5ff)
	return keysym_to_unicode_590_5fe[keysym - 0x590];
    else if (keysym > 0x67f && keysym < 0x700)
	return keysym_to_unicode_680_6ff[keysym - 0x680];
    else if (keysym > 0x7a0 && keysym < 0x7fa)
	return keysym_to_unicode_7a1_7f9[keysym - 0x7a1];
    else if (keysym > 0x8a3 && keysym < 0x8ff)
	return keysym_to_unicode_8a4_8fe[keysym - 0x8a4];
    else if (keysym > 0x9de && keysym < 0x9f9)
	return keysym_to_unicode_9df_9f8[keysym - 0x9df];
    else if (keysym > 0xaa0 && keysym < 0xaff)
	return keysym_to_unicode_aa1_afe[keysym - 0xaa1];
    else if (keysym > 0xcde && keysym < 0xcfb)
	return keysym_to_unicode_cdf_cfa[keysym - 0xcdf];
    else if (keysym > 0xda0 && keysym < 0xdfa)
	return keysym_to_unicode_da1_df9[keysym - 0xda1];
    else if (keysym > 0xe9f && keysym < 0xf00)
	return keysym_to_unicode_ea0_eff[keysym - 0xea0];
    else if (keysym > 0x12a0 && keysym < 0x12ff)
	return keysym_to_unicode_12a1_12fe[keysym - 0x12a1];
    else if (keysym > 0x13bb && keysym < 0x13bf)
	return keysym_to_unicode_13bc_13be[keysym - 0x13bc];
    else if (keysym > 0x14a0 && keysym < 0x1500)
        return keysym_to_unicode_14a1_14ff[keysym - 0x14a1];
    else if (keysym > 0x15cf && keysym < 0x15f7)
	return keysym_to_unicode_15d0_15f6[keysym - 0x15d0];
    else if (keysym > 0x169f && keysym < 0x16f7)
	return keysym_to_unicode_16a0_16f6[keysym - 0x16a0];
    else if (keysym > 0x1e9e && keysym < 0x1f00)
	return keysym_to_unicode_1e9f_1eff[keysym - 0x1e9f];
    else if (keysym > 0x209f && keysym < 0x20ad)
	return keysym_to_unicode_20a0_20ac[keysym - 0x20a0];
    else 
	return 0;
}